

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_address.cpp
# Opt level: O0

ostream * sockpp::operator<<(ostream *os,unix_address *addr)

{
  ostream *poVar1;
  string local_38;
  unix_address *local_18;
  unix_address *addr_local;
  ostream *os_local;
  
  local_18 = addr;
  addr_local = (unix_address *)os;
  poVar1 = std::operator<<(os,"unix:");
  unix_address::path_abi_cxx11_(&local_38,local_18);
  std::operator<<(poVar1,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)addr_local;
}

Assistant:

ostream& operator<<(ostream& os, const unix_address& addr) {
    os << "unix:" << addr.path();
    return os;
}